

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O3

void __thiscall
kj::TlsPrivateKey::TlsPrivateKey(TlsPrivateKey *this,StringPtr pem,Maybe<kj::StringPtr> *password)

{
  BIO *bp;
  EVP_PKEY *pEVar1;
  
  bp = BIO_new_mem_buf(pem.content.ptr,(int)pem.content.size_ + -1);
  pEVar1 = PEM_read_bio_PrivateKey(bp,(EVP_PKEY **)0x0,passwordCallback,password);
  this->pkey = pEVar1;
  if (pEVar1 != (EVP_PKEY *)0x0) {
    BIO_free(bp);
    return;
  }
  anon_unknown_312::throwOpensslError();
}

Assistant:

TlsPrivateKey::TlsPrivateKey(kj::StringPtr pem, kj::Maybe<kj::StringPtr> password) {
  ensureOpenSslInitialized();

  // const_cast apparently needed for older versions of OpenSSL.
  BIO* bio = BIO_new_mem_buf(const_cast<char*>(pem.begin()), pem.size());
  KJ_DEFER(BIO_free(bio));

  pkey = PEM_read_bio_PrivateKey(bio, nullptr, &passwordCallback, &password);
  if (pkey == nullptr) {
    throwOpensslError();
  }
}